

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void emit_restart(phuff_entropy_ptr entropy,int restart_num)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  undefined4 in_ESI;
  long in_RDI;
  int ci;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  emit_eobrun((phuff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (*(int *)(in_RDI + 0x28) == 0) {
    flush_bits((phuff_entropy_ptr)0x1497b0);
    puVar1 = *(undefined1 **)(in_RDI + 0x30);
    *(undefined1 **)(in_RDI + 0x30) = puVar1 + 1;
    *puVar1 = 0xff;
    lVar3 = *(long *)(in_RDI + 0x38) + -1;
    *(long *)(in_RDI + 0x38) = lVar3;
    if (lVar3 == 0) {
      dump_buffer((phuff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    pcVar2 = *(char **)(in_RDI + 0x30);
    *(char **)(in_RDI + 0x30) = pcVar2 + 1;
    *pcVar2 = (char)in_ESI + -0x30;
    lVar3 = *(long *)(in_RDI + 0x38) + -1;
    *(long *)(in_RDI + 0x38) = lVar3;
    if (lVar3 == 0) {
      dump_buffer((phuff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0x50) + 0x19c) == 0) {
    for (iVar4 = 0; iVar4 < *(int *)(*(long *)(in_RDI + 0x50) + 0x144); iVar4 = iVar4 + 1) {
      *(undefined4 *)(in_RDI + 0x58 + (long)iVar4 * 4) = 0;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x6c) = 0;
    *(undefined4 *)(in_RDI + 0x70) = 0;
  }
  return;
}

Assistant:

LOCAL(boolean)
emit_restart(working_state *state, int restart_num)
{
  int ci;

  if (!flush_bits(state))
    return FALSE;

  emit_byte(state, 0xFF, return FALSE);
  emit_byte(state, JPEG_RST0 + restart_num, return FALSE);

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < state->cinfo->comps_in_scan; ci++)
    state->cur.last_dc_val[ci] = 0;

  /* The restart counter is not updated until we successfully write the MCU. */

  return TRUE;
}